

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O2

void amrex::AmrMesh::ProjPeriodic(BoxList *blout,Box *domain,Array<int,_3> *is_per)

{
  int iVar1;
  int iVar2;
  int iVar3;
  BoxList blorig;
  BoxList tmp;
  
  BoxList::BoxList(&blorig,blout);
  iVar3 = -1;
  do {
    if (iVar3 == 2) {
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&blorig);
      return;
    }
    if (iVar3 == 0) {
LAB_00563e03:
      iVar1 = -1;
      while( true ) {
        if (iVar1 == 2) break;
        if (iVar1 == 0) {
LAB_00563e3d:
          for (iVar2 = -1; iVar2 != 2; iVar2 = iVar2 + 1) {
            if (iVar2 == 0) {
LAB_00563e67:
              BoxList::BoxList(&tmp,&blorig);
              BoxList::intersect(&tmp,domain);
              BoxList::catenate(blout,&tmp);
              if ((iVar2 != 0) && (is_per->_M_elems[2] != 0)) {
                BoxList::shift(&blorig,2,
                               (~(domain->bigend).vect[2] + (domain->smallend).vect[2]) * iVar2);
              }
              std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                        ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&tmp);
            }
            else if (is_per->_M_elems[2] != 0) {
              BoxList::shift(&blorig,2,
                             (((domain->bigend).vect[2] - (domain->smallend).vect[2]) + 1) * iVar2);
              goto LAB_00563e67;
            }
          }
          if ((iVar1 != 0) && (is_per->_M_elems[1] != 0)) {
            BoxList::shift(&blorig,1,
                           (~(domain->bigend).vect[1] + (domain->smallend).vect[1]) * iVar1);
          }
        }
        else if (is_per->_M_elems[1] != 0) {
          BoxList::shift(&blorig,1,
                         (((domain->bigend).vect[1] - (domain->smallend).vect[1]) + 1) * iVar1);
          goto LAB_00563e3d;
        }
        iVar1 = iVar1 + 1;
      }
      if ((iVar3 != 0) && (is_per->_M_elems[0] != 0)) {
        BoxList::shift(&blorig,0,(~(domain->bigend).vect[0] + (domain->smallend).vect[0]) * iVar3);
      }
    }
    else if (is_per->_M_elems[0] != 0) {
      BoxList::shift(&blorig,0,(((domain->bigend).vect[0] - (domain->smallend).vect[0]) + 1) * iVar3
                    );
      goto LAB_00563e03;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void
AmrMesh::ProjPeriodic (BoxList& blout, const Box& domain,
                       Array<int,AMREX_SPACEDIM> const& is_per)
{
    //
    // Add periodic translates to blout.
    //

    BoxList blorig(blout);

    int nist,njst,nkst;
    int niend,njend,nkend;
    nist = njst = nkst = 0;
    niend = njend = nkend = 0;
    AMREX_D_TERM( nist , =njst , =nkst ) = -1;
    AMREX_D_TERM( niend , =njend , =nkend ) = +1;

    int ri,rj,rk;
    for (ri = nist; ri <= niend; ri++)
    {
        if (ri != 0 && !is_per[0])
            continue;
        if (ri != 0 && is_per[0])
            blorig.shift(0,ri*domain.length(0));
        for (rj = njst; rj <= njend; rj++)
        {
            if (rj != 0 && !is_per[1])
                continue;
            if (rj != 0 && is_per[1])
                blorig.shift(1,rj*domain.length(1));
            for (rk = nkst; rk <= nkend; rk++)
            {
                if (rk != 0 && !is_per[2])
                    continue;
                if (rk != 0 && is_per[2])
                    blorig.shift(2,rk*domain.length(2));

                BoxList tmp(blorig);
                tmp.intersect(domain);
                blout.catenate(tmp);

                if (rk != 0 && is_per[2])
                    blorig.shift(2,-rk*domain.length(2));
            }
            if (rj != 0 && is_per[1])
                blorig.shift(1,-rj*domain.length(1));
        }
        if (ri != 0 && is_per[0])
            blorig.shift(0,-ri*domain.length(0));
    }
}